

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O3

REF_STATUS ref_fixture_twod_cubic_edge(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  REF_DBL *pRVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined8 uVar8;
  int iVar9;
  REF_INT RVar10;
  long lVar11;
  long lVar12;
  char *pcVar13;
  int iVar14;
  REF_INT cell;
  REF_INT local [27];
  REF_INT local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c [27];
  
  uVar4 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar4 != 0) {
    pcVar13 = "create";
    uVar8 = 0x231;
    goto LAB_00121a9e;
  }
  pRVar1 = *ref_grid_ptr;
  ref_node = pRVar1->node;
  pRVar1->twod = 1;
  iVar6 = ref_mpi->n;
  iVar7 = ref_mpi->id;
  iVar9 = 0;
  iVar5 = (int)(3 / (long)iVar6);
  iVar14 = iVar5 * iVar6;
  if (3 < iVar14) {
    iVar9 = ((((iVar6 + 3) / iVar6) * (iVar14 + -4)) / iVar5 - iVar14) + 4;
  }
  if (iVar7 == iVar9) {
LAB_00121583:
    uVar4 = ref_node_add(ref_node,0,&local_98);
    if (uVar4 != 0) {
      pcVar13 = "add node";
      uVar8 = 0x244;
      goto LAB_00121a9e;
    }
    pRVar2 = ref_node->real;
    lVar12 = (long)local_98;
    pRVar3 = pRVar2 + lVar12 * 0xf;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    pRVar2[lVar12 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar12) && (local_98 < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar11 = ref_node->global[lVar12];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 3) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(3 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_98) && (local_98 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar11 = ref_node->global[lVar12];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_98) && (local_98 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar11 = ref_node->global[lVar12];
        }
      }
      iVar5 = (int)(3 / (long)iVar6);
      iVar6 = 4 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar12] = RVar10;
    uVar4 = ref_node_add(ref_node,2,&local_94);
    if (uVar4 != 0) {
      pcVar13 = "add node";
      uVar8 = 0x245;
      goto LAB_00121a9e;
    }
    pRVar3 = ref_node->real;
    lVar12 = (long)local_94;
    pRVar3[lVar12 * 0xf] = 1.0;
    pRVar3 = pRVar3 + lVar12 * 0xf + 1;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar12) && (local_94 < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar11 = ref_node->global[lVar12];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 3) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(3 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_94) && (local_94 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar11 = ref_node->global[lVar12];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_94) && (local_94 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar11 = ref_node->global[lVar12];
        }
      }
      iVar5 = (int)(3 / (long)iVar6);
      iVar6 = 4 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar12] = RVar10;
    uVar4 = ref_node_add(ref_node,3,&local_90);
    if (uVar4 != 0) {
      pcVar13 = "add node";
      uVar8 = 0x246;
      goto LAB_00121a9e;
    }
    pRVar3 = ref_node->real;
    lVar12 = (long)local_90;
    pRVar3[lVar12 * 0xf] = 0.3333333333333333;
    pRVar3 = pRVar3 + lVar12 * 0xf + 1;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar12) && (local_90 < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar11 = ref_node->global[lVar12];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 3) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(3 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_90) && (local_90 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar11 = ref_node->global[lVar12];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_90) && (local_90 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar11 = ref_node->global[lVar12];
        }
      }
      iVar5 = (int)(3 / (long)iVar6);
      iVar6 = 4 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar12] = RVar10;
    uVar4 = ref_node_add(ref_node,1,local_8c);
    if (uVar4 != 0) {
      pcVar13 = "add node";
      uVar8 = 0x247;
      goto LAB_00121a9e;
    }
    pRVar3 = ref_node->real;
    lVar12 = (long)local_8c[0];
    pRVar3[lVar12 * 0xf] = 0.6666666666666666;
    pRVar3 = pRVar3 + lVar12 * 0xf + 1;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar12) && (local_8c[0] < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar11 = ref_node->global[lVar12];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 3) / iVar6;
    if (lVar11 / (long)iVar7 < (long)(ulong)((int)(3 % (long)iVar6) + 1)) {
      lVar11 = -1;
      if ((-1 < local_8c[0]) && (local_8c[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar11 = ref_node->global[lVar12];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar7);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_8c[0]) && (local_8c[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar11 = ref_node->global[lVar12];
        }
      }
      iVar5 = (int)(3 / (long)iVar6);
      iVar6 = 4 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar11 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar12] = RVar10;
    uVar4 = ref_cell_add(pRVar1->cell[2],&local_98,&local_9c);
    if (uVar4 != 0) {
      pcVar13 = "add tri";
      uVar8 = 0x249;
      goto LAB_00121a9e;
    }
  }
  else {
    iVar6 = (iVar6 + 3) / iVar6;
    iVar9 = (int)(2 / (long)iVar6);
    iVar14 = 4 - iVar14;
    if (iVar14 <= iVar9) {
      iVar9 = (2 - iVar6 * iVar14) / iVar5 + iVar14;
    }
    if (iVar7 == iVar9) goto LAB_00121583;
    iVar9 = (int)(3 / (long)iVar6);
    if (iVar14 <= iVar9) {
      iVar9 = (3 - iVar6 * iVar14) / iVar5 + iVar14;
    }
    if (iVar7 == iVar9) goto LAB_00121583;
    iVar9 = 0;
    if (iVar6 + 1U < 3) {
      iVar9 = iVar6;
    }
    if (iVar14 <= iVar9) {
      iVar9 = (1 - iVar6 * iVar14) / iVar5 + iVar14;
    }
    if (iVar7 == iVar9) goto LAB_00121583;
  }
  uVar4 = ref_node_initialize_n_global(ref_node,4);
  if (uVar4 == 0) {
    return 0;
  }
  pcVar13 = "init glob";
  uVar8 = 0x24c;
LAB_00121a9e:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",uVar8,
         "ref_fixture_twod_cubic_edge",(ulong)uVar4,pcVar13);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_twod_cubic_edge(REF_GRID *ref_grid_ptr,
                                               REF_MPI ref_mpi) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global[REF_CELL_MAX_SIZE_PER];
  REF_INT local[REF_CELL_MAX_SIZE_PER];
  REF_INT cell;
  REF_INT nnodesg = 4;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  ref_grid_twod(ref_grid) = REF_TRUE;

  global[0] = 0;
  global[1] = 2;
  global[2] = 3;
  global[3] = 1;
  global[4] = 30;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    add_that_node(0, 0.0, 0.0, 0.0);
    add_that_node(1, 1.0, 0.0, 0.0);
    add_that_node(2, 1.0 / 3.0, 0.0, 0.0);
    add_that_node(3, 2.0 / 3.0, 0.0, 0.0);

    RSS(ref_cell_add(ref_grid_ed3(ref_grid), local, &cell), "add tri");
  }

  RSS(ref_node_initialize_n_global(ref_node, nnodesg), "init glob");

  return REF_SUCCESS;
}